

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendReceiver.cpp
# Opt level: O2

bool __thiscall SendReceiver::uploadFile(SendReceiver *this,char *pathToFile)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  ifstream *_in;
  undefined1 uVar6;
  curl_httppost *formpost;
  curl_httppost *lastptr;
  char *pathToFile_local;
  string contents;
  string data;
  SendReceiver handler;
  string local_268;
  string filename;
  ifstream in;
  
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  contents._M_dataplus._M_p = (pointer)&contents.field_2;
  contents._M_string_length = 0;
  contents.field_2._M_local_buf[0] = '\0';
  pathToFile_local = pathToFile;
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            ((path *)&handler,&pathToFile_local,auto_format);
  std::filesystem::__cxx11::path::filename((path *)&in,(path *)&handler);
  std::filesystem::__cxx11::path::string(&filename,(path *)&in);
  std::filesystem::__cxx11::path::~path((path *)&in);
  std::filesystem::__cxx11::path::~path((path *)&handler);
  poVar2 = std::operator<<((ostream *)&std::cout,"pathToFile is: ");
  poVar2 = std::operator<<(poVar2,pathToFile_local);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ifstream::ifstream(&in,pathToFile_local,_S_in|_S_bin);
  Helpers::readFromFile_abi_cxx11_((string *)&handler,(Helpers *)&in,_in);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&contents,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handler
            );
  std::__cxx11::string::~string((string *)&handler);
  formpost = (curl_httppost *)0x0;
  lastptr = (curl_httppost *)0x0;
  curl_global_init(3);
  curl_formadd(&formpost,&lastptr,1,"cache-control:",4,"no-cache",0x11);
  curl_formadd(&formpost,&lastptr,1,"content-type:",4,"multipart/form-data",0x11);
  curl_formadd(&formpost,&lastptr,1,"file",0xb,filename._M_dataplus._M_p,0xc,
               contents._M_dataplus._M_p,0xd,contents._M_string_length,0x11);
  lVar3 = curl_easy_init();
  uVar4 = curl_slist_append(0,"pragma:");
  if (lVar3 != 0) {
    curl_easy_setopt(lVar3,0x2712,"https://api.anonfiles.com/upload");
    curl_easy_setopt(lVar3,0x4e2b,writeCallback);
    curl_easy_setopt(lVar3,0x2711,&data);
    curl_easy_setopt(lVar3,0x2728,formpost);
    iVar1 = curl_easy_perform(lVar3);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error, check your internet connection [");
      pcVar5 = (char *)curl_easy_strerror(iVar1);
      poVar2 = std::operator<<(poVar2,pcVar5);
      std::operator<<(poVar2,"]\n");
      uVar6 = 0;
      goto LAB_00106362;
    }
    curl_easy_cleanup(lVar3);
    curl_formfree(formpost);
    curl_slist_free_all(uVar4);
  }
  curl_global_cleanup();
  std::__cxx11::string::string((string *)&local_268,&data);
  JHandler::JHandler(&handler.super_JHandler,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  printRequestData(&handler);
  uVar6 = (this->super_JHandler).status;
  JHandler::~JHandler(&handler.super_JHandler);
LAB_00106362:
  std::ifstream::~ifstream(&in);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&contents);
  std::__cxx11::string::~string((string *)&data);
  return (bool)uVar6;
}

Assistant:

bool SendReceiver::uploadFile(char* pathToFile) {
  std::string data, contents;
  auto filename = fs::path(pathToFile).filename().string();

  std::cout << "pathToFile is: " << pathToFile << std::endl;

  std::ifstream in(pathToFile, std::ios::in | std::ios::binary);

  contents = Helpers::readFromFile(in);

  CURL* curl;
  CURLcode res;

  struct curl_httppost* formpost = nullptr;
  struct curl_httppost* lastptr = nullptr;
  struct curl_slist* headerlist = nullptr;

  curl_global_init(CURL_GLOBAL_ALL);

// set up the header
  curl_formadd(&formpost,
               &lastptr,
               CURLFORM_COPYNAME, "cache-control:",
               CURLFORM_COPYCONTENTS, "no-cache",
               CURLFORM_END);

  curl_formadd(&formpost,
               &lastptr,
               CURLFORM_COPYNAME, "content-type:",
               CURLFORM_COPYCONTENTS, "multipart/form-data",
               CURLFORM_END);

  curl_formadd(&formpost, &lastptr,
               CURLFORM_COPYNAME, "file",  // the (in this case) wanted file-Tag!
               CURLFORM_BUFFER, filename.c_str(),
               CURLFORM_BUFFERPTR, contents.data(),
               CURLFORM_BUFFERLENGTH, contents.size(),
               CURLFORM_END);

  curl = curl_easy_init();
  headerlist = curl_slist_append(headerlist, "pragma:");
  if (curl) {
    curl_easy_setopt(curl, CURLOPT_URL, Anonfiles::Upload);

#ifndef LINUX
    curl_easy_setopt(curl, CURLOPT_SSLCERTTYPE, "PEM");
    curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1L);
    curl_easy_setopt(curl, CURLOPT_CAINFO, NULL);
    curl_easy_setopt(curl, CURLOPT_CAPATH, NULL);
    curl_easy_setopt(curl, CURLOPT_FRESH_CONNECT, 1L);
    curl_easy_setopt(curl, CURLOPT_SSL_CTX_FUNCTION, *sslctx_function); // set void* and load cacert.pem from memory
#endif

    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &writeCallback);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &data);
    curl_easy_setopt(curl, CURLOPT_HTTPPOST, formpost);

    res = curl_easy_perform(curl);

    /* Check for errors */
    if (res != CURLE_OK) {
      std::cerr << "Error, check your internet connection [" << curl_easy_strerror(res) << "]\n";
      return false;
    }

#ifdef DEBUG
    std::cout << std::endl << "[DEBUG|DATA] : " << data << std::endl;
#endif

    curl_easy_cleanup(curl);
    curl_formfree(formpost);
    curl_slist_free_all(headerlist);
  }
  curl_global_cleanup();

  SendReceiver handler(data);
  handler.printRequestData();
  return status;
}